

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void luaE_setdebt(global_State *g,l_mem debt)

{
  long lVar1;
  l_mem tb;
  l_mem debt_local;
  global_State *g_local;
  
  lVar1 = g->GCtotalbytes - g->GCdebt;
  tb = debt;
  if (0x7fffffffffffffff - lVar1 < debt) {
    tb = 0x7fffffffffffffff - lVar1;
  }
  g->GCtotalbytes = lVar1 + tb;
  g->GCdebt = tb;
  return;
}

Assistant:

void luaE_setdebt (global_State *g, l_mem debt) {
  l_mem tb = gettotalbytes(g);
  lua_assert(tb > 0);
  if (debt > MAX_LMEM - tb)
    debt = MAX_LMEM - tb;  /* will make GCtotalbytes == MAX_LMEM */
  g->GCtotalbytes = tb + debt;
  g->GCdebt = debt;
}